

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RootObjectBase.cpp
# Opt level: O2

void __thiscall Js::RootObjectBase::EnsureNoProperty(RootObjectBase *this,PropertyId propertyId)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  DynamicTypeHandler *pDVar5;
  char local_2a;
  char local_29 [7];
  bool isDeclared;
  bool isNonconfigurable;
  
  if ((uint)propertyId < 0x10) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RootObjectBase.cpp"
                                ,0xd9,"(!Js::IsInternalPropertyId(propertyId))",
                                "!Js::IsInternalPropertyId(propertyId)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  local_2a = '\0';
  local_29[0] = '\0';
  pDVar5 = DynamicObject::GetTypeHandler(&this->super_DynamicObject);
  iVar3 = (*pDVar5->_vptr_DynamicTypeHandler[0x1f])
                    (pDVar5,this,(ulong)(uint)propertyId,0,&local_2a,local_29);
  if ((iVar3 != 0) && ((local_2a != '\0' || (local_29[0] == '\x01')))) {
    JavascriptError::ThrowReferenceError
              ((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).
                ptr)->super_JavascriptLibraryBase).scriptContext.ptr,-0x7ff5fbe4,(PCWSTR)0x0);
  }
  return;
}

Assistant:

void
    RootObjectBase::EnsureNoProperty(PropertyId propertyId)
    {
        Assert(!Js::IsInternalPropertyId(propertyId));
        bool isDeclared = false;
        bool isNonconfigurable = false;
        if (GetTypeHandler()->HasRootProperty(this, propertyId, nullptr, &isDeclared, &isNonconfigurable) &&
            (isDeclared || isNonconfigurable))
        {
            JavascriptError::ThrowReferenceError(this->GetScriptContext(), ERRRedeclaration);
        }
    }